

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int ncnn::gru_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  float fVar1;
  char cVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  float *pfVar6;
  long *in_RCX;
  long lVar7;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  long *in_stack_00000008;
  long in_stack_00000010;
  long *in_stack_00000018;
  undefined8 *in_stack_00000020;
  float H;
  float N_1;
  float U_1;
  float *gates_data_1;
  int q_1;
  float *output_data;
  float N;
  char xi_1;
  int i_6;
  int Nx;
  char h_cont_1;
  int i_5;
  int Nh;
  float descale_hc_N;
  float descale_xc_N;
  char *weight_hc_int8_N;
  char *weight_xc_int8_N;
  float *bias_c_BN;
  float *bias_c_WN;
  float U;
  float R;
  char h_cont;
  int i_4;
  int Uh;
  int Rh;
  char xi;
  int i_3;
  int Ux;
  int Rx;
  float descale_hc_U;
  float descale_hc_R;
  float descale_xc_U;
  float descale_xc_R;
  char *weight_hc_int8_U;
  char *weight_hc_int8_R;
  char *weight_xc_int8_U;
  char *weight_xc_int8_R;
  float *bias_c_U;
  float *bias_c_R;
  float *gates_data;
  int q;
  float descale_h;
  float descale_x;
  char *hs;
  char *x_1;
  Option opt_quant_1;
  int i_1;
  float absmax_1;
  int ti;
  int t_1;
  Mat hidden_state_int8_scales;
  Mat hidden_state_int8;
  Option opt_quant;
  int i;
  float absmax;
  float *x;
  int t;
  Mat bottom_blob_int8_scales;
  Mat bottom_blob_int8;
  Mat gates;
  int num_output;
  int T;
  int size;
  int i_2;
  char *ptr;
  int size_1;
  Allocator *in_stack_fffffffffffff748;
  Allocator *in_stack_fffffffffffff750;
  int in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  Mat *in_stack_fffffffffffff760;
  void **ppvVar14;
  undefined8 in_stack_fffffffffffff768;
  Mat *in_stack_fffffffffffff770;
  Option *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  float in_stack_fffffffffffff854;
  Mat *in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  int iVar15;
  int local_71c;
  int local_704;
  int local_700;
  int local_6f8;
  int local_6f4;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  int local_654;
  float local_5ec;
  int local_5e8;
  float local_5e4;
  int local_5e0;
  int local_5dc;
  float *local_5d8;
  int *local_5d0;
  undefined8 local_5c8;
  undefined4 local_5c0;
  long *local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined8 local_598;
  void *local_590;
  int *local_588;
  undefined8 local_580;
  undefined4 local_578;
  long *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  int local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  ulong local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_4fc;
  int local_4f8;
  float local_4f4;
  long local_4f0;
  int local_4e4;
  void *local_4e0;
  int *local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c8;
  long *local_4c0;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined8 local_4a0;
  void *local_498;
  int *local_490;
  long local_488;
  undefined4 local_480;
  long *local_478;
  undefined4 local_470;
  int local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  undefined4 local_450;
  void *local_440;
  int *local_438;
  long local_430;
  undefined4 local_428;
  long *local_420;
  undefined4 local_418;
  int local_414;
  undefined4 local_410;
  undefined4 local_40c;
  int local_408;
  long local_400;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  long *local_3e8;
  long local_3e0;
  long *local_3d8;
  int local_3cc;
  long *local_3c8;
  long *local_3c0;
  int local_3b4;
  float **local_3b0;
  void **local_3a0;
  void **local_390;
  void **local_380;
  void **local_370;
  void **local_360;
  undefined4 local_354;
  long *local_350;
  undefined4 local_344;
  long *local_340;
  undefined4 local_334;
  long *local_330;
  undefined4 local_324;
  long *local_320;
  int local_314;
  long *local_310;
  undefined8 local_308;
  undefined8 local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e4;
  void **local_2e0;
  int local_2d4;
  long *local_2d0;
  int local_2c4;
  void **local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  float **local_220;
  float *local_218;
  void *local_208;
  void *local_1f8;
  void *local_1e8;
  void *local_1d8;
  void **local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b4;
  undefined8 local_1b0;
  int local_1a8;
  int local_1a4;
  void **local_1a0;
  undefined8 local_198;
  undefined4 local_18c;
  undefined8 local_188;
  int local_17c;
  void **local_178;
  undefined8 local_170;
  undefined4 local_164;
  undefined8 local_160;
  int local_154;
  void **local_150;
  undefined8 local_148;
  undefined4 local_13c;
  undefined8 local_138;
  undefined4 local_12c;
  float **local_128;
  long local_120;
  long local_110;
  undefined8 local_100;
  float **local_f8;
  long local_f0;
  void **local_e8;
  undefined8 local_e0;
  float **local_d8;
  undefined8 local_d0;
  float **local_c8;
  long local_c0;
  long local_b0;
  void **local_a8;
  int local_9c;
  void *local_98;
  int local_90;
  undefined1 local_89;
  void **local_88;
  void **local_80;
  int local_74;
  void **local_70;
  void **local_68;
  int local_5c;
  int local_4c;
  long *local_48;
  int local_3c;
  int local_2c;
  int local_1c;
  long *local_18;
  int local_c;
  long *local_8;
  
  local_3ec = *(int *)((long)in_RDI + 0x2c);
  local_3f0 = (int)in_RDI[6];
  local_3f4 = *(int *)((long)in_RSI + 0x2c);
  local_308 = in_stack_00000020[2];
  local_2f0 = &local_440;
  local_2f4 = 2;
  local_300 = 4;
  local_440 = (void *)0x0;
  local_438 = (int *)0x0;
  local_430 = 0;
  local_428 = 0;
  local_420 = (long *)0x0;
  local_418 = 0;
  local_414 = 0;
  local_410 = 0;
  local_40c = 0;
  local_408 = 0;
  local_400 = 0;
  local_3e8 = in_R9;
  local_3e0 = in_R8;
  local_3d8 = in_RCX;
  local_3cc = in_EDX;
  local_3c8 = in_RSI;
  local_3c0 = in_RDI;
  local_2f8 = local_3f4;
  Mat::create(in_stack_fffffffffffff760,in_stack_fffffffffffff75c,in_stack_fffffffffffff758,
              (size_t)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  local_360 = &local_440;
  if (local_440 != (void *)0x0) {
    local_1c8 = local_360;
  }
  if (local_440 != (void *)0x0 && local_400 * local_408 != 0) {
    local_1c0 = in_stack_00000020[2];
    local_1a0 = &local_498;
    local_1a4 = local_3ec;
    local_1a8 = local_3f0;
    local_1b0 = 1;
    local_1b4 = 1;
    local_498 = (void *)0x0;
    local_490 = (int *)0x0;
    local_488 = 0;
    local_480 = 0;
    local_478 = (long *)0x0;
    local_470 = 0;
    local_46c = 0;
    local_468 = 0;
    local_464 = 0;
    local_460 = 0;
    local_458 = 0;
    Mat::create(in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
                (int)in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760,
                in_stack_fffffffffffff75c,in_stack_fffffffffffff750);
    local_198 = in_stack_00000020[2];
    local_178 = &local_4e0;
    local_17c = local_3f0;
    local_188 = 4;
    local_18c = 1;
    local_4e0 = (void *)0x0;
    local_4d8 = (int *)0x0;
    local_4d0 = 0;
    local_4c8 = 0;
    local_4c0 = (long *)0x0;
    local_4b8 = 0;
    local_4b4 = 0;
    local_4b0 = 0;
    local_4ac = 0;
    local_4a8 = 0;
    local_4a0 = 0;
    Mat::create(in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
                (size_t)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,
                in_stack_fffffffffffff750);
    for (local_4e4 = 0; iVar15 = (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
        local_4e4 < local_3f0; local_4e4 = local_4e4 + 1) {
      local_310 = local_3c0;
      local_314 = local_4e4;
      local_4f0 = *local_3c0 +
                  (long)*(int *)((long)local_3c0 + 0x2c) * (long)local_4e4 * local_3c0[2];
      local_4f4 = 0.0;
      for (local_4f8 = 0; local_4f8 < local_3ec; local_4f8 = local_4f8 + 1) {
        dVar13 = std::fabs((double)(ulong)*(uint *)(local_4f0 + (long)local_4f8 * 4));
        local_4fc = SUB84(dVar13,0);
        pfVar6 = std::max<float>(&local_4f4,&local_4fc);
        local_4f4 = *pfVar6;
      }
      local_b0 = (long)local_4e4;
      local_a8 = &local_4e0;
      *(float *)((long)local_4e0 + local_b0 * 4) = 127.0 / local_4f4;
    }
    local_548 = *in_stack_00000020;
    local_538 = *(undefined4 *)(in_stack_00000020 + 2);
    uStack_534 = *(undefined4 *)((long)in_stack_00000020 + 0x14);
    uStack_530 = *(undefined4 *)(in_stack_00000020 + 3);
    uStack_52c = *(undefined4 *)((long)in_stack_00000020 + 0x1c);
    uStack_520 = in_stack_00000020[5];
    local_518 = in_stack_00000020[6];
    uStack_510 = in_stack_00000020[7];
    uStack_540 = in_stack_00000020[2];
    local_528 = in_stack_00000020[4] & 0xffffffffffffff;
    quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                     in_stack_fffffffffffff858,
                     (Mat *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                     in_stack_fffffffffffff848);
    local_170 = in_stack_00000020[2];
    local_150 = &local_590;
    local_154 = local_3f4;
    local_160 = 1;
    local_164 = 1;
    local_590 = (void *)0x0;
    local_588 = (int *)0x0;
    local_580 = 0;
    local_578 = 0;
    local_570 = (long *)0x0;
    local_568 = 0;
    local_564 = 0;
    local_560 = 0;
    local_55c = 0;
    local_558 = 0;
    local_550 = 0;
    Mat::create(in_stack_fffffffffffff770,iVar15,(size_t)in_stack_fffffffffffff760,
                in_stack_fffffffffffff75c,in_stack_fffffffffffff750);
    local_148 = in_stack_00000020[2];
    local_128 = &local_5d8;
    local_12c = 1;
    local_138 = 4;
    local_13c = 1;
    local_5d8 = (float *)0x0;
    local_5d0 = (int *)0x0;
    local_5c8 = 0;
    local_5c0 = 0;
    local_5b8 = (long *)0x0;
    local_5b0 = 0;
    local_5ac = 0;
    local_5a8 = 0;
    local_5a4 = 0;
    local_5a0 = 0;
    local_598 = 0;
    Mat::create(in_stack_fffffffffffff770,iVar15,(size_t)in_stack_fffffffffffff760,
                in_stack_fffffffffffff75c,in_stack_fffffffffffff750);
    for (local_5dc = 0; local_5dc < local_3f0; local_5dc = local_5dc + 1) {
      iVar15 = local_5dc;
      if (local_3cc != 0) {
        iVar15 = (local_3f0 + -1) - local_5dc;
      }
      local_5e4 = 0.0;
      local_5e0 = iVar15;
      for (local_5e8 = 0; local_5e8 < local_3f4; local_5e8 = local_5e8 + 1) {
        local_c0 = (long)local_5e8;
        in_stack_fffffffffffff858 = (Mat *)(*in_stack_00000018 + local_c0 * 4);
        dVar13 = std::fabs((double)(ulong)*(uint *)&in_stack_fffffffffffff858->data);
        in_stack_fffffffffffff854 = SUB84(dVar13,0);
        local_5ec = in_stack_fffffffffffff854;
        in_stack_fffffffffffff848 = (Option *)std::max<float>(&local_5e4,&local_5ec);
        local_5e4 = *(float *)in_stack_fffffffffffff848;
      }
      if ((local_5e4 != 0.0) || (NAN(local_5e4))) {
        local_d8 = &local_5d8;
        local_e0 = 0;
        *local_5d8 = 127.0 / local_5e4;
        quantize_to_int8((Mat *)CONCAT44(iVar15,in_stack_fffffffffffff860),in_stack_fffffffffffff858
                         ,(Mat *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                         in_stack_fffffffffffff848);
      }
      else {
        local_c8 = &local_5d8;
        local_d0 = 0;
        *local_5d8 = 1.0;
        local_88 = &local_590;
        local_89 = 0;
        local_90 = (int)local_550 * local_558;
        local_98 = local_590;
        for (local_9c = 0; local_80 = local_88, local_9c < local_90; local_9c = local_9c + 1) {
          *(undefined1 *)((long)local_590 + (long)local_9c) = 0;
        }
      }
      pvVar5 = local_498;
      pvVar4 = local_590;
      local_70 = &local_498;
      local_74 = local_5e0;
      lVar7 = (long)local_46c * (long)local_5e0 * local_488;
      local_68 = &local_590;
      local_f0 = (long)local_5e0;
      local_e8 = &local_4e0;
      fVar8 = 1.0 / *(float *)((long)local_4e0 + local_f0 * 4);
      local_f8 = &local_5d8;
      local_100 = 0;
      fVar9 = 1.0 / *local_5d8;
      for (local_654 = 0; local_654 < local_3f4; local_654 = local_654 + 1) {
        local_2c0 = &local_440;
        local_2c4 = local_654;
        pfVar6 = (float *)((long)local_440 + (long)local_414 * (long)local_654 * local_430);
        local_320 = local_3e8;
        local_324 = 0;
        local_330 = local_3e8;
        local_334 = 1;
        local_8 = local_3d8;
        local_c = local_654;
        local_1c = local_3f4 + local_654;
        local_18 = local_3d8;
        local_2c = local_654;
        local_3c = local_3f4 + local_654;
        fVar11 = *(float *)(local_3e0 + (long)(local_3f4 + local_654) * 4);
        fVar12 = *(float *)(in_stack_00000010 + (long)(local_3f4 + local_654) * 4);
        local_6a4 = 0;
        local_6a8 = 0;
        for (local_6ac = 0; local_6ac < local_3ec; local_6ac = local_6ac + 1) {
          cVar2 = *(char *)((long)pvVar5 + local_6ac + lVar7);
          local_6a4 = (int)*(char *)(*local_3d8 +
                                     (long)*(int *)((long)local_3d8 + 0x2c) * (long)local_654 *
                                     local_3d8[2] + (long)local_6ac) * (int)cVar2 + local_6a4;
          local_6a8 = (int)*(char *)(*local_3d8 +
                                     (long)*(int *)((long)local_3d8 + 0x2c) * (long)local_1c *
                                     local_3d8[2] + (long)local_6ac) * (int)cVar2 + local_6a8;
        }
        local_6b4 = 0;
        local_6b8 = 0;
        for (local_6bc = 0; local_6bc < local_3f4; local_6bc = local_6bc + 1) {
          cVar2 = *(char *)((long)pvVar4 + (long)local_6bc);
          local_6b4 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) *
                                     (long)local_654 * in_stack_00000008[2] + (long)local_6bc) *
                      (int)cVar2 + local_6b4;
          local_6b8 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) * (long)local_3c
                                     * in_stack_00000008[2] + (long)local_6bc) * (int)cVar2 +
                      local_6b8;
        }
        fVar1 = *(float *)(*local_3e8 + (long)*(int *)((long)local_3e8 + 0x2c) * local_3e8[2] +
                          (long)local_654 * 4);
        fVar10 = expf(-(*(float *)(*local_3e8 + (long)local_654 * 4) +
                        (float)local_6a4 *
                        fVar8 * (1.0 / *(float *)(local_3e0 + (long)local_654 * 4)) +
                       (float)local_6b4 *
                       fVar9 * (1.0 / *(float *)(in_stack_00000010 + (long)local_654 * 4))));
        fVar11 = expf(-(fVar1 + (float)local_6a8 * fVar8 * (1.0 / fVar11) +
                       (float)local_6b8 * fVar9 * (1.0 / fVar12)));
        local_340 = local_3e8;
        local_344 = 2;
        local_350 = local_3e8;
        local_354 = 3;
        local_4c = local_3f4 * 2 + local_654;
        local_48 = local_3d8;
        local_5c = local_3f4 * 2 + local_654;
        local_6f4 = 0;
        for (local_6f8 = 0; local_6f8 < local_3f4; local_6f8 = local_6f8 + 1) {
          local_6f4 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) * (long)local_5c
                                     * in_stack_00000008[2] + (long)local_6f8) *
                      (int)*(char *)((long)pvVar4 + (long)local_6f8) + local_6f4;
        }
        local_700 = 0;
        for (local_704 = 0; local_704 < local_3ec; local_704 = local_704 + 1) {
          local_700 = (int)*(char *)(*local_3d8 +
                                     (long)*(int *)((long)local_3d8 + 0x2c) * (long)local_4c *
                                     local_3d8[2] + (long)local_704) *
                      (int)*(char *)((long)pvVar5 + local_704 + lVar7) + local_700;
        }
        fVar12 = tanhf(*(float *)(*local_3e8 +
                                  (long)*(int *)((long)local_3e8 + 0x2c) * 2 * local_3e8[2] +
                                 (long)local_654 * 4) +
                       (1.0 / (fVar10 + 1.0)) *
                       (*(float *)(*local_3e8 +
                                   (long)*(int *)((long)local_3e8 + 0x2c) * 3 * local_3e8[2] +
                                  (long)local_654 * 4) +
                       (float)local_6f4 *
                       fVar9 * (1.0 / *(float *)(in_stack_00000010 +
                                                (long)(local_3f4 * 2 + local_654) * 4))) +
                       (float)local_700 *
                       fVar8 * (1.0 / *(float *)(local_3e0 + (long)(local_3f4 * 2 + local_654) * 4))
                      );
        *pfVar6 = 1.0 / (fVar11 + 1.0);
        pfVar6[1] = fVar12;
      }
      local_2d0 = local_3c8;
      local_2d4 = local_5e0;
      lVar7 = *local_3c8;
      iVar15 = *(int *)((long)local_3c8 + 0x2c);
      lVar3 = local_3c8[2];
      for (local_71c = 0; local_71c < local_3f4; local_71c = local_71c + 1) {
        local_2e4 = local_71c;
        local_2e0 = &local_440;
        pfVar6 = (float *)((long)local_440 + (long)local_414 * (long)local_71c * local_430);
        fVar8 = *pfVar6;
        local_110 = (long)local_71c;
        fVar8 = (1.0 - fVar8) * pfVar6[1] + fVar8 * *(float *)(*in_stack_00000018 + local_110 * 4);
        local_120 = (long)local_71c;
        *(float *)(*in_stack_00000018 + local_120 * 4) = fVar8;
        *(float *)(lVar7 + (long)iVar15 * (long)local_5e0 * lVar3 + (long)local_71c * 4) = fVar8;
      }
    }
    local_3b4 = 0;
    local_450 = 1;
    local_3b0 = &local_5d8;
    local_220 = local_3b0;
    if (local_5d0 != (int *)0x0) {
      local_224 = 0xffffffff;
      LOCK();
      local_228 = *local_5d0;
      *local_5d0 = *local_5d0 + -1;
      UNLOCK();
      if (local_228 == 1) {
        if (local_5b8 == (long *)0x0) {
          local_218 = local_5d8;
          if (local_5d8 != (float *)0x0) {
            free(local_5d8);
          }
        }
        else {
          (**(code **)(*local_5b8 + 0x18))(local_5b8,local_5d8);
        }
      }
    }
    local_5d8 = (float *)0x0;
    local_5c8 = 0;
    local_5c0 = 0;
    local_5b0 = 0;
    local_5ac = 0;
    local_5a8 = 0;
    local_5a4 = 0;
    local_5a0 = 0;
    local_598 = 0;
    local_5d0 = (int *)0x0;
    ppvVar14 = &local_590;
    local_3a0 = ppvVar14;
    local_240 = ppvVar14;
    if (local_588 != (int *)0x0) {
      local_244 = 0xffffffff;
      LOCK();
      local_248 = *local_588;
      *local_588 = *local_588 + -1;
      UNLOCK();
      if (local_248 == 1) {
        if (local_570 == (long *)0x0) {
          local_208 = local_590;
          if (local_590 != (void *)0x0) {
            free(local_590);
          }
        }
        else {
          (**(code **)(*local_570 + 0x18))(local_570,local_590);
        }
      }
    }
    *ppvVar14 = (void *)0x0;
    ppvVar14[2] = (void *)0x0;
    *(undefined4 *)(ppvVar14 + 3) = 0;
    *(undefined4 *)(ppvVar14 + 5) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x2c) = 0;
    *(undefined4 *)(ppvVar14 + 6) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x34) = 0;
    *(undefined4 *)(ppvVar14 + 7) = 0;
    ppvVar14[8] = (void *)0x0;
    ppvVar14[1] = (void *)0x0;
    ppvVar14 = &local_4e0;
    local_390 = ppvVar14;
    local_260 = ppvVar14;
    if (local_4d8 != (int *)0x0) {
      local_264 = 0xffffffff;
      LOCK();
      local_268 = *local_4d8;
      *local_4d8 = *local_4d8 + -1;
      UNLOCK();
      if (local_268 == 1) {
        if (local_4c0 == (long *)0x0) {
          local_1f8 = local_4e0;
          if (local_4e0 != (void *)0x0) {
            free(local_4e0);
          }
        }
        else {
          (**(code **)(*local_4c0 + 0x18))(local_4c0,local_4e0);
        }
      }
    }
    *ppvVar14 = (void *)0x0;
    ppvVar14[2] = (void *)0x0;
    *(undefined4 *)(ppvVar14 + 3) = 0;
    *(undefined4 *)(ppvVar14 + 5) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x2c) = 0;
    *(undefined4 *)(ppvVar14 + 6) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x34) = 0;
    *(undefined4 *)(ppvVar14 + 7) = 0;
    ppvVar14[8] = (void *)0x0;
    ppvVar14[1] = (void *)0x0;
    ppvVar14 = &local_498;
    local_380 = ppvVar14;
    local_280 = ppvVar14;
    if (local_490 != (int *)0x0) {
      local_284 = 0xffffffff;
      LOCK();
      local_288 = *local_490;
      *local_490 = *local_490 + -1;
      UNLOCK();
      if (local_288 == 1) {
        if (local_478 == (long *)0x0) {
          local_1e8 = local_498;
          if (local_498 != (void *)0x0) {
            free(local_498);
          }
        }
        else {
          (**(code **)(*local_478 + 0x18))(local_478,local_498);
        }
      }
    }
    *ppvVar14 = (void *)0x0;
    ppvVar14[2] = (void *)0x0;
    *(undefined4 *)(ppvVar14 + 3) = 0;
    *(undefined4 *)(ppvVar14 + 5) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x2c) = 0;
    *(undefined4 *)(ppvVar14 + 6) = 0;
    *(undefined4 *)((long)ppvVar14 + 0x34) = 0;
    *(undefined4 *)(ppvVar14 + 7) = 0;
    ppvVar14[8] = (void *)0x0;
    ppvVar14[1] = (void *)0x0;
  }
  else {
    local_3b4 = -100;
    local_450 = 1;
  }
  local_370 = &local_440;
  if (local_438 != (int *)0x0) {
    local_2a4 = 0xffffffff;
    LOCK();
    local_2a8 = *local_438;
    *local_438 = *local_438 + -1;
    UNLOCK();
    if (local_2a8 == 1) {
      local_2a0 = local_370;
      if (local_420 == (long *)0x0) {
        local_1d8 = local_440;
        if (local_440 != (void *)0x0) {
          free(local_440);
        }
      }
      else {
        (**(code **)(*local_420 + 0x18))(local_420,local_440);
      }
    }
  }
  return local_3b4;
}

Assistant:

static int gru_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const signed char* weight_xc_int8_R = weight_xc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_xc_int8_U = weight_xc_int8.row<const signed char>(num_output * 1 + q);
            const signed char* weight_hc_int8_R = weight_hc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_hc_int8_U = weight_hc_int8.row<const signed char>(num_output * 1 + q);

            const float descale_xc_R = 1.f / weight_xc_int8_scales[num_output * 0 + q];
            const float descale_xc_U = 1.f / weight_xc_int8_scales[num_output * 1 + q];
            const float descale_hc_R = 1.f / weight_hc_int8_scales[num_output * 0 + q];
            const float descale_hc_U = 1.f / weight_hc_int8_scales[num_output * 1 + q];

            int Rx = 0;
            int Ux = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Rx += weight_xc_int8_R[i] * xi;
                Ux += weight_xc_int8_U[i] * xi;
            }

            int Rh = 0;
            int Uh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Rh += weight_hc_int8_R[i] * h_cont;
                Uh += weight_hc_int8_U[i] * h_cont;
            }

            float R = bias_c_R[q] + Rx * (descale_x * descale_xc_R) + Rh * (descale_h * descale_hc_R);
            float U = bias_c_U[q] + Ux * (descale_x * descale_xc_U) + Uh * (descale_h * descale_hc_U);

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + expf(-R));
            U = 1.f / (1.f + expf(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const signed char* weight_xc_int8_N = weight_xc_int8.row<const signed char>(num_output * 2 + q);
            const signed char* weight_hc_int8_N = weight_hc_int8.row<const signed char>(num_output * 2 + q);

            const float descale_xc_N = 1.f / weight_xc_int8_scales[num_output * 2 + q];
            const float descale_hc_N = 1.f / weight_hc_int8_scales[num_output * 2 + q];

            int Nh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Nh += weight_hc_int8_N[i] * h_cont;
            }

            int Nx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Nx += weight_xc_int8_N[i] * xi;
            }

            float N = bias_c_BN[q] + Nh * (descale_h * descale_hc_N);
            N = bias_c_WN[q] + R * N + Nx * (descale_x * descale_xc_N);

            // tanh(N)
            N = tanhf(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}